

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Block * __thiscall soul::StructuralParser::parseStatementAsNewBlock(StructuralParser *this)

{
  Scope *pSVar1;
  bool bVar2;
  Block *this_00;
  Statement *s;
  void *local_40;
  Context local_38;
  pool_ptr<soul::AST::Function> local_20;
  
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x275da0);
  if (bVar2) {
    local_20.object = (Function *)0x0;
    this_00 = parseBracedBlock(this,&local_20);
  }
  else {
    getContext(&local_38,this);
    local_40 = (void *)0x0;
    this_00 = allocate<soul::AST::Block,soul::AST::Context,decltype(nullptr)>
                        (this,&local_38,&local_40);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&local_38);
    pSVar1 = this->currentScope;
    this->currentScope = &this_00->super_Scope;
    s = parseStatement(this);
    AST::Block::addStatement(this_00,s);
    this->currentScope = pSVar1;
  }
  return this_00;
}

Assistant:

AST::Block& parseStatementAsNewBlock()
    {
        if (matches (Operator::openBrace))
            return parseBracedBlock ({});

        auto& newBlock = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, newBlock);
        newBlock.addStatement (parseStatement());
        return newBlock;
    }